

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

void CP_PeerSetupHandler(CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs
                        )

{
  SstStream s;
  void *__ptr;
  CP_PeerConnection *pCVar1;
  
  if (_perfstubs_initialized == 1) {
    if (CP_PeerSetupHandler::timer == (void *)0x0) {
      __ptr = (void *)ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_reader.c"
                                          ,"CP_PeerSetupHandler",0x308);
      CP_PeerSetupHandler::timer = (void *)ps_timer_create_(__ptr);
      free(__ptr);
    }
    ps_timer_start_(CP_PeerSetupHandler::timer);
  }
  s = *Msg_v;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  CP_verbose(s,TraceVerbose,"Received peer setup from rank %d, conn %p\n",
             (ulong)*(uint *)((long)Msg_v + 8),conn);
  if (s->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
    CP_verbose(s,TraceVerbose,"Allocating connections to writer\n");
    pCVar1 = (CP_PeerConnection *)calloc(0x18,(long)*(int *)((long)Msg_v + 0xc));
    s->ConnectionsToWriter = pCVar1;
  }
  CP_verbose(s,TraceVerbose,"Received peer setup from rank %d, conn %p\n",
             (ulong)*(uint *)((long)Msg_v + 8),conn);
  if ((long)*(int *)((long)Msg_v + 8) != -1) {
    s->ConnectionsToWriter[*(int *)((long)Msg_v + 8)].CMconn = conn;
    CMConnection_add_reference(conn);
    s->FailureContactRank = *(int *)((long)Msg_v + 8);
  }
  CMconn_register_close_handler(conn,ReaderConnCloseHandler,s);
  pthread_cond_signal((pthread_cond_t *)&s->DataCondition);
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_PeerSetupHandler::timer);
    return;
  }
  return;
}

Assistant:

extern void CP_PeerSetupHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                                attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    struct _PeerSetupMsg *Msg = (struct _PeerSetupMsg *)Msg_v;
    Stream = (SstStream)Msg->RS_Stream;
    STREAM_MUTEX_LOCK(Stream);
    CP_verbose(Stream, TraceVerbose, "Received peer setup from rank %d, conn %p\n", Msg->WriterRank,
               conn);
    if (!Stream->ConnectionsToWriter)
    {
        CP_verbose(Stream, TraceVerbose, "Allocating connections to writer\n");
        Stream->ConnectionsToWriter = calloc(sizeof(CP_PeerConnection), Msg->WriterCohortSize);
    }
    CP_verbose(Stream, TraceVerbose, "Received peer setup from rank %d, conn %p\n", Msg->WriterRank,
               conn);
    if (Msg->WriterRank != -1)
    {
        Stream->ConnectionsToWriter[Msg->WriterRank].CMconn = conn;
        CMConnection_add_reference(conn);
        Stream->FailureContactRank = Msg->WriterRank;
    }
    CMconn_register_close_handler(conn, ReaderConnCloseHandler, (void *)Stream);
    STREAM_CONDITION_SIGNAL(Stream);
    STREAM_MUTEX_UNLOCK(Stream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}